

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ProcessAnnotation
          (HtmlparserCppTest *this,string *annotation)

{
  HtmlParser *source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  bool bVar1;
  int iVar2;
  Mode mode;
  HtmlParser *this_00;
  size_type sVar3;
  mapped_type *ppHVar4;
  char *pcVar5;
  pointer this_01;
  pointer str_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pairs;
  
  pairs.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pairs.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pairs.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SplitStringIntoKeyValuePairs(annotation,"=",",",&pairs);
  source = &this->parser_;
  str_00 = pairs.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (str_00 == pairs.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&pairs);
      return;
    }
    StripWhiteSpace(&str_00->first);
    str = &str_00->second;
    StripWhiteSpace(str);
    iVar2 = std::__cxx11::string::compare((char *)str_00);
    if (iVar2 == 0) {
      ValidateState(this,str);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)str_00);
      if (iVar2 == 0) {
        ValidateTag(this,str);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)str_00);
        if (iVar2 == 0) {
          ValidateAttribute(this,str);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)str_00);
          if (iVar2 == 0) {
            ValidateValue(this,str);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)str_00);
            if (iVar2 == 0) {
              ValidateAttributeType(this,str);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)str_00);
              if (iVar2 == 0) {
                ValidateAttributeQuoted(this,str);
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)str_00);
                if (iVar2 == 0) {
                  ValidateInJavascript(this,str);
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar2 == 0) {
                    ValidateJavascriptQuoted(this,str);
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar2 == 0) {
                      ValidateJavascriptState(this,str);
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar2 == 0) {
                        ValidateInCss(this,str);
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar2 == 0) {
                          ValidateLine(this,str);
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar2 == 0) {
                            ValidateColumn(this,str);
                          }
                          else {
                            iVar2 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar2 == 0) {
                              ValidateValueIndex(this,str);
                            }
                            else {
                              iVar2 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar2 == 0) {
                                ValidateIsUrlStart(this,str);
                              }
                              else {
                                iVar2 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar2 == 0) {
                                  sVar3 = std::
                                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                          ::count(&this->contextMap,str);
                                  if (sVar3 == 0) {
                                    this_00 = (HtmlParser *)operator_new(8);
                                    HtmlParser::HtmlParser(this_00);
                                    ppHVar4 = std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::operator[](&this->contextMap,str);
                                    *ppHVar4 = this_00;
                                  }
                                  ppHVar4 = std::
                                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                            ::operator[](&this->contextMap,str);
                                  HtmlParser::CopyFrom(*ppHVar4,source);
                                }
                                else {
                                  iVar2 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar2 == 0) {
                                    sVar3 = std::
                                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                            ::count(&this->contextMap,str);
                                    if (sVar3 == 0) {
                                      pcVar5 = "contextMap.count(iter->second)";
LAB_001083d7:
                                      fprintf(_stderr,"Check failed: %s\n",pcVar5);
                                      exit(1);
                                    }
                                    ppHVar4 = std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::operator[](&this->contextMap,str);
                                    HtmlParser::CopyFrom(source,*ppHVar4);
                                  }
                                  else {
                                    iVar2 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar2 == 0) {
                                      bVar1 = StringToBool(str);
                                      if (bVar1) {
                                        HtmlParser::Reset(source);
                                      }
                                    }
                                    else {
                                      this_01 = str_00;
                                      iVar2 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar2 == 0) {
                                        mode = NameToId((HtmlparserCppTest *)this_01,
                                                        (IdNameMap *)kResetModeMap,str);
                                        HtmlParser::ResetMode(source,mode);
                                      }
                                      else {
                                        iVar2 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar2 != 0) {
                                          pcVar5 = "false";
                                          goto LAB_001083d7;
                                        }
                                        bVar1 = StringToBool(str);
                                        if (bVar1) {
                                          HtmlParser::InsertText(source);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    str_00 = str_00 + 1;
  } while( true );
}

Assistant:

void HtmlparserCppTest::ProcessAnnotation(const string &annotation) {
  vector< pair< string, string > > pairs;
  SplitStringIntoKeyValuePairs(annotation, "=", ",", &pairs);

  vector< pair< string, string > >::iterator iter;

  iter = pairs.begin();
  for (iter = pairs.begin(); iter != pairs.end(); ++iter) {
    StripWhiteSpace(&iter->first);
    StripWhiteSpace(&iter->second);

    if (iter->first.compare("state") == 0) {
      ValidateState(iter->second);
    } else if (iter->first.compare("tag") == 0) {
      ValidateTag(iter->second);
    } else if (iter->first.compare("attr") == 0) {
      ValidateAttribute(iter->second);
    } else if (iter->first.compare("value") == 0) {
      ValidateValue(iter->second);
    } else if (iter->first.compare("attr_type") == 0) {
      ValidateAttributeType(iter->second);
    } else if (iter->first.compare("attr_quoted") == 0) {
      ValidateAttributeQuoted(iter->second);
    } else if (iter->first.compare("in_js") == 0) {
      ValidateInJavascript(iter->second);
    } else if (iter->first.compare("js_quoted") == 0) {
      ValidateJavascriptQuoted(iter->second);
    } else if (iter->first.compare("js_state") == 0) {
      ValidateJavascriptState(iter->second);
    } else if (iter->first.compare("in_css") == 0) {
      ValidateInCss(iter->second);
    } else if (iter->first.compare("line_number") == 0) {
      ValidateLine(iter->second);
    } else if (iter->first.compare("column_number") == 0) {
      ValidateColumn(iter->second);
    } else if (iter->first.compare("value_index") == 0) {
      ValidateValueIndex(iter->second);
    } else if (iter->first.compare("is_url_start") == 0) {
      ValidateIsUrlStart(iter->second);
    } else if (iter->first.compare("save_context") == 0) {
      if (!contextMap.count(iter->second)) {
        contextMap[iter->second] = new HtmlParser();
      }
      contextMap[iter->second]->CopyFrom(&parser_);
    } else if (iter->first.compare("load_context") == 0) {
      CHECK(contextMap.count(iter->second));
      parser_.CopyFrom(contextMap[iter->second]);
    } else if (iter->first.compare("reset") == 0) {
      if (StringToBool(iter->second)) {
        parser_.Reset();
      }
    } else if (iter->first.compare("reset_mode") == 0) {
      HtmlParser::Mode mode =
           static_cast<HtmlParser::Mode>(NameToId(kResetModeMap, iter->second));
      parser_.ResetMode(mode);
    } else if (iter->first.compare("insert_text") == 0) {
      if (StringToBool(iter->second)) {
        parser_.InsertText();
      }
    } else {
      FAIL() << "Unknown test directive: " << iter->first;
    }
  }
}